

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varinfo.c
# Opt level: O1

int varinfo_set_variant(varinfo *info,char *variant)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  vardata *pvVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int data;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  iVar1 = symtab_get_t(info->data->symtab,variant,1,(int *)((long)&uStack_28 + 4));
  if (iVar1 == -1) {
    fprintf(_stderr,"no variant %s\n",variant);
  }
  else {
    iVar1 = info->data->variants[uStack_28._4_4_].varset;
    if (info->variants[iVar1] == -1 || info->variants[iVar1] == uStack_28._4_4_) {
      pvVar3 = info->data;
      uVar4 = (ulong)(uint)pvVar3->featuresnum;
      if (0 < pvVar3->featuresnum) {
        lVar5 = 0x18;
        uVar6 = 0;
        do {
          if ((info->fmask[uVar6 >> 5 & 0x7ffffff] >> ((uint)uVar6 & 0x1f) & 1) != 0) {
            iVar2 = mask_intersect(*(uint32_t **)((long)&pvVar3->features->name + lVar5),
                                   pvVar3->variants[uStack_28._4_4_].fmask,(int)uVar4);
            if (iVar2 != -1) {
              varinfo_set_variant_cold_2();
              return -1;
            }
          }
          uVar6 = uVar6 + 1;
          pvVar3 = info->data;
          uVar4 = (ulong)pvVar3->featuresnum;
          lVar5 = lVar5 + 0x40;
        } while ((long)uVar6 < (long)uVar4);
      }
      info->variants[iVar1] = uStack_28._4_4_;
      mask_or(info->fmask,pvVar3->variants[uStack_28._4_4_].fmask,pvVar3->featuresnum);
      return 0;
    }
    varinfo_set_variant_cold_1();
  }
  return -1;
}

Assistant:

int varinfo_set_variant(struct varinfo *info, const char *variant) {
	int data;
	if (symtab_get_t(info->data->symtab, variant, VARDATA_ST_VARIANT, &data) == -1) {
		fprintf(stderr, "no variant %s\n", variant);
		return -1;
	}
	int varset = info->data->variants[data].varset;
	if (info->variants[varset] != -1 && info->variants[varset] != data) {
		fprintf(stderr, "a variant from varset %s has already been selected\n", info->data->varsets[varset].name);
		return -1;
	}
	int i;
	for (i = 0; i < info->data->featuresnum; i++) {
		if (mask_get(info->fmask, i) && mask_intersect(info->data->features[i].cfmask, info->data->variants[data].fmask, info->data->featuresnum) != -1) {
			fprintf(stderr, "variant %s conflicts with feature %s\n", info->data->variants[data].name, info->data->features[i].name);
			return -1;
		}
	}
	info->variants[varset] = data;
	mask_or(info->fmask, info->data->variants[data].fmask, info->data->featuresnum);
	return 0;
}